

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QArrayDataPointer<bool> * __thiscall
QArrayDataPointer<bool>::operator=(QArrayDataPointer<bool> *this,QArrayDataPointer<bool> *other)

{
  Data *pDVar1;
  bool *pbVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  
  pDVar1 = other->d;
  pbVar2 = other->ptr;
  qVar3 = other->size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar4 = &this->d->super_QArrayData;
  this->d = pDVar1;
  this->ptr = pbVar2;
  this->size = qVar3;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,1,0x10);
    }
  }
  return this;
}

Assistant:

QArrayDataPointer &operator=(const QArrayDataPointer &other) noexcept
    {
        QArrayDataPointer tmp(other);
        this->swap(tmp);
        return *this;
    }